

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O1

string * __thiscall
dap::BasicTypeInfo<dap::SourceBreakpoint>::name_abi_cxx11_
          (string *__return_storage_ptr__,BasicTypeInfo<dap::SourceBreakpoint> *this)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (this->name_)._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

inline std::string name() const override { return name_; }